

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BindTargetListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindTargetListSyntax,slang::syntax::BindTargetListSyntax_const&>
          (BumpAllocator *this,BindTargetListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  BindTargetListSyntax *pBVar8;
  
  pBVar8 = (BindTargetListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BindTargetListSyntax *)this->endPtr < pBVar8 + 1) {
    pBVar8 = (BindTargetListSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pBVar8 + 1);
  }
  (pBVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pBVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pBVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pBVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->colon).field_0x2;
  NVar6.raw = (args->colon).numFlags.raw;
  uVar7 = (args->colon).rawLen;
  pIVar2 = (args->colon).info;
  (pBVar8->colon).kind = (args->colon).kind;
  (pBVar8->colon).field_0x2 = uVar5;
  (pBVar8->colon).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar8->colon).rawLen = uVar7;
  (pBVar8->colon).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->targets).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->targets).super_SyntaxListBase.super_SyntaxNode.parent;
  (pBVar8->targets).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->targets).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar8->targets).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pBVar8->targets).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pBVar8->targets).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->targets).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pBVar8->targets).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pBVar8->targets).super_SyntaxListBase.childCount =
       (args->targets).super_SyntaxListBase.childCount;
  (pBVar8->targets).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f8998
  ;
  sVar3 = (args->targets).elements._M_extent._M_extent_value;
  (pBVar8->targets).elements._M_ptr = (args->targets).elements._M_ptr;
  (pBVar8->targets).elements._M_extent._M_extent_value = sVar3;
  return pBVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }